

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

IssuanceParameter *
cfd::core::ConfidentialTransaction::CalculateIssuanceValue
          (IssuanceParameter *__return_storage_ptr__,Txid *txid,uint32_t vout,bool is_blind,
          ByteData256 *contract_hash,ByteData256 *asset_entropy)

{
  bool bVar1;
  string local_160;
  string local_140;
  CfdSourceLocation local_120;
  undefined1 local_108 [8];
  ConfidentialAssetId token;
  ConfidentialAssetId asset;
  BlindFactor entropy;
  ConfidentialAssetId local_90;
  BlindFactor local_68;
  byte local_31;
  ByteData256 *local_30;
  ByteData256 *asset_entropy_local;
  ByteData256 *contract_hash_local;
  bool is_blind_local;
  Txid *pTStack_18;
  uint32_t vout_local;
  Txid *txid_local;
  IssuanceParameter *result;
  
  local_31 = 0;
  local_30 = asset_entropy;
  asset_entropy_local = contract_hash;
  contract_hash_local._3_1_ = is_blind;
  contract_hash_local._4_4_ = vout;
  pTStack_18 = txid;
  txid_local = (Txid *)__return_storage_ptr__;
  IssuanceParameter::IssuanceParameter(__return_storage_ptr__);
  bVar1 = ByteData256::Equals(local_30,(ByteData256 *)kEmptyByteData256);
  if (bVar1) {
    CalculateAssetEntropy
              ((BlindFactor *)&asset.version_,pTStack_18,contract_hash_local._4_4_,
               asset_entropy_local);
    BlindFactor::operator=(&__return_storage_ptr__->entropy,(BlindFactor *)&asset.version_);
    CalculateAsset((ConfidentialAssetId *)&token.version_,(BlindFactor *)&asset.version_);
    ConfidentialAssetId::operator=
              (&__return_storage_ptr__->asset,(ConfidentialAssetId *)&token.version_);
    CalculateReissuanceToken
              ((ConfidentialAssetId *)local_108,(BlindFactor *)&asset.version_,
               (bool)(contract_hash_local._3_1_ & 1));
    ConfidentialAssetId::operator=(&__return_storage_ptr__->token,(ConfidentialAssetId *)local_108);
    local_120.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_120.filename = local_120.filename + 1;
    local_120.line = 0x864;
    local_120.funcname = "CalculateIssuanceValue";
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_140,&__return_storage_ptr__->asset);
    ConfidentialAssetId::GetHex_abi_cxx11_(&local_160,&__return_storage_ptr__->token);
    logger::info<std::__cxx11::string,std::__cxx11::string,bool&>
              (&local_120,"asset[{}] token[{}] is_blind[{}]",&local_140,&local_160,
               (bool *)((long)&contract_hash_local + 3));
    ::std::__cxx11::string::~string((string *)&local_160);
    ::std::__cxx11::string::~string((string *)&local_140);
    local_31 = 1;
    ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)local_108);
    ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)&token.version_);
    BlindFactor::~BlindFactor((BlindFactor *)&asset.version_);
  }
  else {
    BlindFactor::BlindFactor(&local_68,asset_entropy_local);
    BlindFactor::operator=(&__return_storage_ptr__->entropy,&local_68);
    BlindFactor::~BlindFactor(&local_68);
    CalculateAsset(&local_90,&__return_storage_ptr__->entropy);
    ConfidentialAssetId::operator=(&__return_storage_ptr__->asset,&local_90);
    ConfidentialAssetId::~ConfidentialAssetId(&local_90);
    local_31 = 1;
  }
  if ((local_31 & 1) == 0) {
    IssuanceParameter::~IssuanceParameter(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransaction::CalculateIssuanceValue(
    const Txid &txid, uint32_t vout, bool is_blind,
    const ByteData256 &contract_hash, const ByteData256 &asset_entropy) {
  IssuanceParameter result;

  if (!asset_entropy.Equals(kEmptyByteData256)) {
    // reissue
    result.entropy = BlindFactor(contract_hash);
    result.asset = CalculateAsset(
        result.entropy);  // ConfidentialAssetId(ByteData(asset));
    return result;
  }

  // calculate issue value
  const BlindFactor entropy = CalculateAssetEntropy(txid, vout, contract_hash);
  result.entropy = entropy;

  // calculate asset value
  const ConfidentialAssetId asset = CalculateAsset(entropy);
  result.asset = asset;

  // calculate token
  const ConfidentialAssetId token =
      CalculateReissuanceToken(entropy, is_blind);
  result.token = token;

  info(
      CFD_LOG_SOURCE, "asset[{}] token[{}] is_blind[{}]",
      result.asset.GetHex(), result.token.GetHex(), is_blind);
  return result;
}